

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

void sub_one_frombill(obj *obj,monst *shkp)

{
  undefined8 uVar1;
  uint uVar2;
  uint uVar3;
  bill_x *pbVar4;
  obj *obj_00;
  int iVar5;
  undefined8 *puVar6;
  obj *otmp;
  bill_x *bp;
  monst *shkp_local;
  obj *obj_local;
  
  pbVar4 = onbill(obj,shkp,'\0');
  if (pbVar4 == (bill_x *)0x0) {
    if ((*(uint *)&obj->field_0x4a >> 2 & 1) != 0) {
      warning("sub_one_frombill: unpaid object not on bill");
      *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xfffffffb;
    }
  }
  else {
    *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xfffffffb;
    if (obj->quan < pbVar4->bquan) {
      obj_00 = (obj *)malloc(0x68);
      memcpy(obj_00,obj,0x68);
      uVar2 = flags.ident;
      uVar3 = flags.ident + 1;
      obj_00->o_id = flags.ident;
      flags.ident = uVar3;
      pbVar4->bo_id = uVar2;
      obj_00->where = '\0';
      iVar5 = pbVar4->bquan - obj->quan;
      pbVar4->bquan = iVar5;
      obj_00->quan = iVar5;
      obj_00->owt = 0;
      obj_00->onamelth = '\0';
      obj_00->oxlth = 0;
      *(uint *)&obj_00->field_0x4a = *(uint *)&obj_00->field_0x4a & 0xff9fffff;
      pbVar4->useup = '\x01';
      add_to_billobjs(obj_00);
    }
    else {
      *(short *)((long)&shkp[0x1b].misc_worn_check + 2) =
           *(short *)((long)&shkp[0x1b].misc_worn_check + 2) + -1;
      puVar6 = (undefined8 *)
               (*(long *)&shkp[0x1b].mnum +
               (long)*(short *)((long)&shkp[0x1b].misc_worn_check + 2) * 0x10);
      uVar1 = *puVar6;
      pbVar4->bo_id = (int)uVar1;
      pbVar4->useup = (char)((ulong)uVar1 >> 0x20);
      *(int3 *)&pbVar4->field_0x5 = (int3)((ulong)uVar1 >> 0x28);
      uVar1 = puVar6[1];
      pbVar4->price = (int)uVar1;
      pbVar4->bquan = (int)((ulong)uVar1 >> 0x20);
    }
  }
  return;
}

Assistant:

static void sub_one_frombill(struct obj *obj, struct monst *shkp)
{
	struct bill_x *bp;

	if ((bp = onbill(obj, shkp, FALSE)) != 0) {
		struct obj *otmp;

		obj->unpaid = 0;
		if (bp->bquan > obj->quan){
			otmp = newobj(0);
			*otmp = *obj;
			bp->bo_id = otmp->o_id = flags.ident++;
			otmp->where = OBJ_FREE;
			otmp->quan = (bp->bquan -= obj->quan);
			otmp->owt = 0;	/* superfluous */
			otmp->onamelth = 0;
			otmp->oxlth = 0;
			otmp->oattached = OATTACHED_NOTHING;
			bp->useup = 1;
			add_to_billobjs(otmp);
			return;
		}
		ESHK(shkp)->billct--;
		*bp = ESHK(shkp)->bill_p[ESHK(shkp)->billct];
		
		return;
	} else if (obj->unpaid) {
		warning("sub_one_frombill: unpaid object not on bill");
		obj->unpaid = 0;
	}
}